

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

HelicsTime helicsDataBufferToTime(HelicsDataBuffer data)

{
  double dVar1;
  DataType baseType;
  SmallBuffer *pSVar2;
  Time val;
  Time local_30;
  data_view local_28;
  
  pSVar2 = getBuffer(data);
  if (pSVar2 == (SmallBuffer *)0x0) {
    dVar1 = -1.785e+39;
  }
  else {
    local_28.dblock._M_len = pSVar2->bufferSize;
    local_28.dblock._M_str = (char *)pSVar2->heap;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_28.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    baseType = helics::detail::detectType((byte *)local_28.dblock._M_str);
    helics::valueExtract(&local_28,baseType,&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.ref.
                super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    dVar1 = (double)(local_30.internalTimeCode % 1000000000) * 1e-09 +
            (double)(local_30.internalTimeCode / 1000000000);
  }
  return dVar1;
}

Assistant:

HelicsTime helicsDataBufferToTime(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_TIME_INVALID;
    }
    helics::Time val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return static_cast<HelicsTime>(val);
}